

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupSegmentTree::Initialize(RowGroupSegmentTree *this,PersistentTableData *data)

{
  _Head_base<0UL,_duckdb::MetadataReader_*,_false> _Var1;
  MetadataManager *manager;
  _Head_base<0UL,_duckdb::MetadataReader_*,_false> this_00;
  
  this->current_row_group = 0;
  this->max_row_group = data->row_group_count;
  LOCK();
  (this->super_SegmentTree<duckdb::RowGroup,_true>).finished_loading._M_base._M_i = false;
  UNLOCK();
  manager = BlockManager::GetMetadataManager(this->collection->block_manager);
  this_00._M_head_impl = (MetadataReader *)operator_new(0x70);
  MetadataReader::MetadataReader
            (this_00._M_head_impl,manager,data->block_pointer,
             (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,EXISTING_BLOCKS
            );
  _Var1._M_head_impl =
       (this->reader).
       super_unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>._M_t.
       super___uniq_ptr_impl<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::MetadataReader_*,_std::default_delete<duckdb::MetadataReader>_>
       .super__Head_base<0UL,_duckdb::MetadataReader_*,_false>._M_head_impl;
  (this->reader).
  super_unique_ptr<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MetadataReader,_std::default_delete<duckdb::MetadataReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MetadataReader_*,_std::default_delete<duckdb::MetadataReader>_>.
  super__Head_base<0UL,_duckdb::MetadataReader_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl != (MetadataReader *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ReadStream + 0x10))();
    return;
  }
  return;
}

Assistant:

void RowGroupSegmentTree::Initialize(PersistentTableData &data) {
	D_ASSERT(data.row_group_count > 0);
	current_row_group = 0;
	max_row_group = data.row_group_count;
	finished_loading = false;
	reader = make_uniq<MetadataReader>(collection.GetMetadataManager(), data.block_pointer);
}